

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifAig.c
# Opt level: O1

Abc_Ntk_t * Io_ReadBlifAsAig(char *pFileName,int fCheck)

{
  char cVar1;
  void *pvVar2;
  uint *puVar3;
  long *plVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  FILE *pFVar9;
  Io_BlifMan_t *p;
  Vec_Ptr_t *pVVar10;
  void **ppvVar11;
  long lVar12;
  char *pcVar13;
  Io_BlifObj_t *pIVar14;
  Io_BlifObj_t **__s;
  ulong uVar15;
  Abc_Ntk_t *pAVar16;
  Abc_Obj_t *pAVar17;
  Abc_Obj_t *pObj;
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 aVar18;
  size_t sVar19;
  int iVar20;
  byte *pbVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  long lVar25;
  char *pcVar26;
  byte *pbVar27;
  byte bVar28;
  byte bVar29;
  
  pFVar9 = fopen(pFileName,"rb");
  if (pFVar9 == (FILE *)0x0) {
    puts("Io_Blif(): The file is unavailable (absent or open).");
    return (Abc_Ntk_t *)0x0;
  }
  fclose(pFVar9);
  p = (Io_BlifMan_t *)malloc(0x298);
  memset(p,0,0x298);
  pVVar10 = (Vec_Ptr_t *)malloc(0x10);
  pVVar10->nCap = 0x200;
  pVVar10->nSize = 0;
  ppvVar11 = (void **)malloc(0x1000);
  pVVar10->pArray = ppvVar11;
  p->vLines = pVVar10;
  pVVar10 = (Vec_Ptr_t *)malloc(0x10);
  pVVar10->nCap = 0x200;
  pVVar10->nSize = 0;
  ppvVar11 = (void **)malloc(0x1000);
  pVVar10->pArray = ppvVar11;
  p->vInputs = pVVar10;
  pVVar10 = (Vec_Ptr_t *)malloc(0x10);
  pVVar10->nCap = 0x200;
  pVVar10->nSize = 0;
  ppvVar11 = (void **)malloc(0x1000);
  pVVar10->pArray = ppvVar11;
  p->vOutputs = pVVar10;
  pVVar10 = (Vec_Ptr_t *)malloc(0x10);
  pVVar10->nCap = 0x200;
  pVVar10->nSize = 0;
  ppvVar11 = (void **)malloc(0x1000);
  pVVar10->pArray = ppvVar11;
  p->vLatches = pVVar10;
  pVVar10 = (Vec_Ptr_t *)malloc(0x10);
  pVVar10->nCap = 0x200;
  pVVar10->nSize = 0;
  ppvVar11 = (void **)malloc(0x1000);
  pVVar10->pArray = ppvVar11;
  p->vNames = pVVar10;
  pVVar10 = (Vec_Ptr_t *)malloc(0x10);
  pVVar10->nCap = 0x200;
  pVVar10->nSize = 0;
  ppvVar11 = (void **)malloc(0x1000);
  pVVar10->pArray = ppvVar11;
  p->vTokens = pVVar10;
  pVVar10 = (Vec_Ptr_t *)malloc(0x10);
  pVVar10->nCap = 0x200;
  pVVar10->nSize = 0;
  ppvVar11 = (void **)malloc(0x1000);
  pVVar10->pArray = ppvVar11;
  p->vPis = pVVar10;
  pVVar10 = (Vec_Ptr_t *)malloc(0x10);
  pVVar10->nCap = 0x200;
  pVVar10->nSize = 0;
  ppvVar11 = (void **)malloc(0x1000);
  pVVar10->pArray = ppvVar11;
  p->vPos = pVVar10;
  pVVar10 = (Vec_Ptr_t *)malloc(0x10);
  pVVar10->nCap = 0x200;
  pVVar10->nSize = 0;
  ppvVar11 = (void **)malloc(0x1000);
  pVVar10->pArray = ppvVar11;
  p->vLis = pVVar10;
  pVVar10 = (Vec_Ptr_t *)malloc(0x10);
  pVVar10->nCap = 0x200;
  pVVar10->nSize = 0;
  ppvVar11 = (void **)malloc(0x1000);
  pVVar10->pArray = ppvVar11;
  p->vLos = pVVar10;
  p->pFileName = pFileName;
  pFVar9 = fopen(pFileName,"rb");
  if (pFVar9 == (FILE *)0x0) {
    pcVar13 = "Io_BlifLoadFile(): The file is unavailable (absent or open).";
LAB_0032e61c:
    puts(pcVar13);
    pcVar13 = (char *)0x0;
  }
  else {
    fseek(pFVar9,0,2);
    lVar12 = ftell(pFVar9);
    iVar6 = (int)lVar12;
    if (iVar6 == 0) {
      fclose(pFVar9);
      pcVar13 = "Io_BlifLoadFile(): The file is empty.";
      goto LAB_0032e61c;
    }
    pcVar13 = (char *)malloc((long)(iVar6 + 10));
    rewind(pFVar9);
    fread(pcVar13,(long)iVar6,1,pFVar9);
    fclose(pFVar9);
    builtin_strncpy(pcVar13 + iVar6,"\n.end\n",7);
  }
  p->pBuffer = pcVar13;
  if (pcVar13 == (char *)0x0) {
    Io_BlifFree(p);
    return (Abc_Ntk_t *)0x0;
  }
  pVVar10 = p->vLines;
  uVar8 = pVVar10->nCap;
  if (pVVar10->nSize == uVar8) {
    if ((int)uVar8 < 0x10) {
      if (pVVar10->pArray == (void **)0x0) {
        ppvVar11 = (void **)malloc(0x80);
      }
      else {
        ppvVar11 = (void **)realloc(pVVar10->pArray,0x80);
      }
      pVVar10->pArray = ppvVar11;
      iVar6 = 0x10;
    }
    else {
      iVar6 = uVar8 * 2;
      if (iVar6 <= (int)uVar8) goto LAB_0032e6a8;
      if (pVVar10->pArray == (void **)0x0) {
        ppvVar11 = (void **)malloc((ulong)uVar8 << 4);
      }
      else {
        ppvVar11 = (void **)realloc(pVVar10->pArray,(ulong)uVar8 << 4);
      }
      pVVar10->pArray = ppvVar11;
    }
    pVVar10->nCap = iVar6;
  }
LAB_0032e6a8:
  iVar6 = pVVar10->nSize;
  pVVar10->nSize = iVar6 + 1;
  pVVar10->pArray[iVar6] = pcVar13;
  bVar5 = false;
  pcVar13 = p->pBuffer;
LAB_0032e6c4:
  pcVar26 = pcVar13;
  pcVar13 = pcVar26 + 1;
  cVar1 = *pcVar26;
  if (cVar1 == '\n') {
    *pcVar26 = '\0';
    pVVar10 = p->vLines;
    uVar8 = pVVar10->nCap;
    if (pVVar10->nSize == uVar8) {
      if ((int)uVar8 < 0x10) {
        if (pVVar10->pArray == (void **)0x0) {
          ppvVar11 = (void **)malloc(0x80);
        }
        else {
          ppvVar11 = (void **)realloc(pVVar10->pArray,0x80);
        }
        pVVar10->pArray = ppvVar11;
        iVar6 = 0x10;
      }
      else {
        iVar6 = uVar8 * 2;
        if (iVar6 <= (int)uVar8) goto LAB_0032e75c;
        if (pVVar10->pArray == (void **)0x0) {
          ppvVar11 = (void **)malloc((ulong)uVar8 << 4);
        }
        else {
          ppvVar11 = (void **)realloc(pVVar10->pArray,(ulong)uVar8 << 4);
        }
        pVVar10->pArray = ppvVar11;
      }
      pVVar10->nCap = iVar6;
    }
LAB_0032e75c:
    iVar6 = pVVar10->nSize;
    pVVar10->nSize = iVar6 + 1;
    pVVar10->pArray[iVar6] = pcVar13;
    bVar5 = false;
  }
  else if (cVar1 == '#') {
    bVar5 = true;
  }
  else if (cVar1 == '\0') goto LAB_0032e781;
  if (bVar5) {
    *pcVar26 = '\0';
  }
  goto LAB_0032e6c4;
LAB_0032e781:
  pVVar10 = p->vLines;
  if (0 < pVVar10->nSize) {
    lVar12 = 0;
LAB_0032e79c:
    pbVar27 = (byte *)pVVar10->pArray[lVar12];
    if (*pbVar27 != 0) {
      pbVar21 = pbVar27 + -2;
      while (((p->pBuffer <= pbVar21 && ((ulong)*pbVar21 < 0x21)) &&
             ((0x100002600U >> ((ulong)*pbVar21 & 0x3f) & 1) != 0))) {
        pbVar21 = pbVar21 + -1;
      }
      if (*pbVar21 == 0x5c) {
        do {
          *pbVar21 = 0x20;
          pbVar27 = pbVar21 + 1;
          pbVar21 = pbVar21 + 1;
        } while (*pbVar27 != 0);
        *pbVar21 = 0x20;
      }
      else {
        do {
          pbVar21 = pbVar27;
          uVar15 = (ulong)*pbVar21;
          if (0x2e < uVar15) goto LAB_0032e9bf;
          pbVar27 = pbVar21 + 1;
        } while ((0x100002600U >> (uVar15 & 0x3f) & 1) != 0);
        if (uVar15 == 0x2e) {
          pbVar27 = pbVar21 + 1;
          iVar6 = strncmp((char *)pbVar27,"names",5);
          if (iVar6 == 0) {
            pVVar10 = p->vNames;
          }
          else {
            iVar6 = strncmp((char *)pbVar27,"latch",5);
            if (iVar6 == 0) {
              pVVar10 = p->vLatches;
            }
            else {
              iVar6 = strncmp((char *)pbVar27,"inputs",6);
              if (iVar6 == 0) {
                pVVar10 = p->vInputs;
              }
              else {
                iVar6 = strncmp((char *)pbVar27,"outputs",7);
                if (iVar6 != 0) {
                  iVar6 = strncmp((char *)pbVar27,"model",5);
                  if (iVar6 == 0) {
                    p->pModel = (char *)pbVar27;
                    goto LAB_0032e9bf;
                  }
                  iVar6 = strncmp((char *)pbVar27,"end",3);
                  if ((iVar6 == 0) || (iVar6 = strncmp((char *)pbVar27,"exdc",4), iVar6 == 0))
                  goto LAB_0032e9ea;
                  sVar19 = strlen((char *)pbVar21);
                  if (pbVar21[sVar19 - 1] == 0xd) {
                    pbVar21[sVar19 - 1] = 0;
                  }
                  uVar15 = (ulong)p->vLines->nSize;
                  uVar23 = 0xffffffff;
                  if (0 < (long)uVar15) {
                    uVar22 = 0;
                    do {
                      if (pbVar21 < p->vLines->pArray[uVar22]) {
                        uVar23 = uVar22 & 0xffffffff;
                        break;
                      }
                      uVar22 = uVar22 + 1;
                    } while (uVar15 != uVar22);
                  }
                  fprintf(_stdout,"Line %d: Skipping line \"%s\".\n",uVar23,pbVar21);
                  goto LAB_0032e9bf;
                }
                pVVar10 = p->vOutputs;
              }
            }
          }
          uVar8 = pVVar10->nCap;
          if (pVVar10->nSize == uVar8) {
            if ((int)uVar8 < 0x10) {
              if (pVVar10->pArray == (void **)0x0) {
                ppvVar11 = (void **)malloc(0x80);
              }
              else {
                ppvVar11 = (void **)realloc(pVVar10->pArray,0x80);
              }
              pVVar10->pArray = ppvVar11;
              iVar6 = 0x10;
            }
            else {
              iVar6 = uVar8 * 2;
              if (iVar6 <= (int)uVar8) goto LAB_0032e9ad;
              if (pVVar10->pArray == (void **)0x0) {
                ppvVar11 = (void **)malloc((ulong)uVar8 << 4);
              }
              else {
                ppvVar11 = (void **)realloc(pVVar10->pArray,(ulong)uVar8 << 4);
              }
              pVVar10->pArray = ppvVar11;
            }
            pVVar10->nCap = iVar6;
          }
LAB_0032e9ad:
          iVar6 = pVVar10->nSize;
          pVVar10->nSize = iVar6 + 1;
          pVVar10->pArray[iVar6] = pbVar27;
        }
      }
    }
LAB_0032e9bf:
    lVar12 = lVar12 + 1;
    pVVar10 = p->vLines;
    if (pVVar10->nSize <= lVar12) goto LAB_0032e9ea;
    goto LAB_0032e79c;
  }
LAB_0032e9ea:
  lVar12 = (long)p->vInputs->nSize;
  if (lVar12 < 1) {
    iVar6 = 0x200;
  }
  else {
    lVar25 = 0;
    iVar6 = 0;
    do {
      pbVar27 = (byte *)p->vInputs->pArray[lVar25];
      bVar28 = 1;
LAB_0032ea06:
      uVar15 = (ulong)*pbVar27;
      if (0x20 < uVar15) {
LAB_0032ea37:
        bVar29 = 1;
LAB_0032ea19:
        iVar6 = iVar6 + (uint)(bVar28 & (bVar29 ^ 1));
        pbVar27 = pbVar27 + 1;
        bVar28 = bVar29;
        goto LAB_0032ea06;
      }
      if ((0x100002600U >> (uVar15 & 0x3f) & 1) != 0) {
        bVar29 = 0;
        goto LAB_0032ea19;
      }
      if (uVar15 != 0) goto LAB_0032ea37;
      lVar25 = lVar25 + 1;
    } while (lVar25 != lVar12);
    iVar6 = iVar6 + 0x200;
  }
  iVar6 = iVar6 + p->vLatches->nSize + p->vNames->nSize;
  p->nObjects = iVar6;
  pIVar14 = (Io_BlifObj_t *)malloc((long)iVar6 << 5);
  p->pObjects = pIVar14;
  memset(pIVar14,0,(long)iVar6 << 5);
  p->nTableSize = iVar6 / 2 + 1;
  sVar19 = (long)(iVar6 / 2) * 8 + 8;
  __s = (Io_BlifObj_t **)malloc(sVar19);
  p->pTable = __s;
  memset(__s,0,sVar19);
  Io_BlifSplitIntoTokens(p->vTokens,p->pModel,'\0');
  iVar6 = p->vTokens->nSize;
  if (iVar6 < 1) goto LAB_0032f731;
  ppvVar11 = p->vTokens->pArray;
  pcVar13 = (char *)*ppvVar11;
  iVar7 = strcmp(pcVar13,"model");
  if (iVar7 != 0) {
    __assert_fail("!strcmp(pToken, \"model\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlifAig.c"
                  ,0x268,"int Io_BlifParseModel(Io_BlifMan_t *, char *)");
  }
  if (iVar6 == 2) {
    p->pModel = (char *)ppvVar11[1];
  }
  else {
    uVar15 = (ulong)p->vLines->nSize;
    uVar23 = 0xffffffff;
    if (0 < (long)uVar15) {
      uVar22 = 0;
      do {
        if (pcVar13 < p->vLines->pArray[uVar22]) {
          uVar23 = uVar22 & 0xffffffff;
          break;
        }
        uVar22 = uVar22 + 1;
      } while (uVar15 != uVar22);
    }
    sprintf(p->sError,"Line %d: Model line has %d entries while it should have 2.",uVar23);
  }
  if (iVar6 == 2) {
    pVVar10 = p->vInputs;
    if (0 < pVVar10->nSize) {
      lVar12 = 0;
      do {
        Io_BlifSplitIntoTokens(p->vTokens,(char *)pVVar10->pArray[lVar12],'\0');
        pVVar10 = p->vTokens;
        iVar6 = pVVar10->nSize;
        if (iVar6 < 1) goto LAB_0032f731;
        iVar7 = strcmp((char *)*pVVar10->pArray,"inputs");
        if (iVar7 != 0) {
          __assert_fail("!strcmp(pToken, \"inputs\")",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlifAig.c"
                        ,0x284,"int Io_BlifParseInputs(Io_BlifMan_t *, char *)");
        }
        if (iVar6 != 1) {
          lVar25 = 1;
          do {
            pcVar13 = (char *)pVVar10->pArray[lVar25];
            pIVar14 = Io_BlifHashFindOrAdd(p,pcVar13);
            if ((*(uint *)pIVar14 & 1) != 0) {
              uVar15 = (ulong)p->vLines->nSize;
              uVar23 = 0xffffffff;
              if ((long)uVar15 < 1) goto LAB_0032f42e;
              uVar22 = 0;
              goto LAB_0032f41c;
            }
            *(uint *)pIVar14 = *(uint *)pIVar14 | 1;
            pVVar10 = p->vPis;
            uVar8 = pVVar10->nCap;
            if (pVVar10->nSize == uVar8) {
              if ((int)uVar8 < 0x10) {
                if (pVVar10->pArray == (void **)0x0) {
                  ppvVar11 = (void **)malloc(0x80);
                }
                else {
                  ppvVar11 = (void **)realloc(pVVar10->pArray,0x80);
                }
                pVVar10->pArray = ppvVar11;
                iVar6 = 0x10;
              }
              else {
                iVar6 = uVar8 * 2;
                if (iVar6 <= (int)uVar8) goto LAB_0032ec51;
                if (pVVar10->pArray == (void **)0x0) {
                  ppvVar11 = (void **)malloc((ulong)uVar8 << 4);
                }
                else {
                  ppvVar11 = (void **)realloc(pVVar10->pArray,(ulong)uVar8 << 4);
                }
                pVVar10->pArray = ppvVar11;
              }
              pVVar10->nCap = iVar6;
            }
LAB_0032ec51:
            iVar6 = pVVar10->nSize;
            pVVar10->nSize = iVar6 + 1;
            pVVar10->pArray[iVar6] = pIVar14;
            lVar25 = lVar25 + 1;
            pVVar10 = p->vTokens;
          } while (lVar25 < pVVar10->nSize);
        }
        lVar12 = lVar12 + 1;
        pVVar10 = p->vInputs;
      } while (lVar12 < pVVar10->nSize);
    }
    pVVar10 = p->vOutputs;
    if (0 < pVVar10->nSize) {
      lVar12 = 0;
      do {
        Io_BlifSplitIntoTokens(p->vTokens,(char *)pVVar10->pArray[lVar12],'\0');
        pVVar10 = p->vTokens;
        iVar6 = pVVar10->nSize;
        if (iVar6 < 1) goto LAB_0032f731;
        iVar7 = strcmp((char *)*pVVar10->pArray,"outputs");
        if (iVar7 != 0) {
          __assert_fail("!strcmp(pToken, \"outputs\")",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlifAig.c"
                        ,0x2a5,"int Io_BlifParseOutputs(Io_BlifMan_t *, char *)");
        }
        if (iVar6 != 1) {
          lVar25 = 1;
          do {
            pcVar13 = (char *)pVVar10->pArray[lVar25];
            pIVar14 = Io_BlifHashFindOrAdd(p,pcVar13);
            if ((undefined1  [32])((undefined1  [32])*pIVar14 & (undefined1  [32])0x2) !=
                (undefined1  [32])0x0) {
              uVar15 = (ulong)p->vLines->nSize;
              uVar23 = 0xffffffff;
              if (0 < (long)uVar15) {
                uVar22 = 0;
                do {
                  if (pcVar13 < p->vLines->pArray[uVar22]) {
                    uVar23 = uVar22 & 0xffffffff;
                    break;
                  }
                  uVar22 = uVar22 + 1;
                } while (uVar15 != uVar22);
              }
              fprintf(_stdout,
                      "Line %d: Primary output (%s) is defined more than once (warning only).\n",
                      uVar23,pcVar13);
            }
            *(byte *)pIVar14 = *(byte *)pIVar14 | 2;
            pVVar10 = p->vPos;
            uVar8 = pVVar10->nCap;
            if (pVVar10->nSize == uVar8) {
              if ((int)uVar8 < 0x10) {
                if (pVVar10->pArray == (void **)0x0) {
                  ppvVar11 = (void **)malloc(0x80);
                }
                else {
                  ppvVar11 = (void **)realloc(pVVar10->pArray,0x80);
                }
                pVVar10->pArray = ppvVar11;
                iVar6 = 0x10;
              }
              else {
                iVar6 = uVar8 * 2;
                if (iVar6 <= (int)uVar8) goto LAB_0032edca;
                if (pVVar10->pArray == (void **)0x0) {
                  ppvVar11 = (void **)malloc((ulong)uVar8 << 4);
                }
                else {
                  ppvVar11 = (void **)realloc(pVVar10->pArray,(ulong)uVar8 << 4);
                }
                pVVar10->pArray = ppvVar11;
              }
              pVVar10->nCap = iVar6;
            }
LAB_0032edca:
            iVar6 = pVVar10->nSize;
            pVVar10->nSize = iVar6 + 1;
            pVVar10->pArray[iVar6] = pIVar14;
            lVar25 = lVar25 + 1;
            pVVar10 = p->vTokens;
          } while (lVar25 < pVVar10->nSize);
        }
        lVar12 = lVar12 + 1;
        pVVar10 = p->vOutputs;
      } while (lVar12 < pVVar10->nSize);
    }
    pVVar10 = p->vLatches;
    if (0 < pVVar10->nSize) {
      lVar12 = 0;
      do {
        Io_BlifSplitIntoTokens(p->vTokens,(char *)pVVar10->pArray[lVar12],'\0');
        iVar6 = p->vTokens->nSize;
        if (iVar6 < 1) goto LAB_0032f731;
        ppvVar11 = p->vTokens->pArray;
        pcVar13 = (char *)*ppvVar11;
        iVar7 = strcmp(pcVar13,"latch");
        if (iVar7 != 0) {
          __assert_fail("!strcmp(pToken, \"latch\")",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlifAig.c"
                        ,0x2c3,"int Io_BlifParseLatch(Io_BlifMan_t *, char *)");
        }
        if (iVar6 < 3) {
          uVar15 = (ulong)p->vLines->nSize;
          uVar23 = 0xffffffff;
          if ((long)uVar15 < 1) goto LAB_0032f605;
          uVar22 = 0;
          goto LAB_0032f467;
        }
        uVar8 = 2;
        if (iVar6 != 3) {
          uVar8 = atoi((char *)ppvVar11[3]);
        }
        if (2 < uVar8) {
          uVar15 = (ulong)p->vLines->nSize;
          uVar23 = 0xffffffff;
          if ((long)uVar15 < 1) goto LAB_0032f61c;
          uVar22 = 0;
          goto LAB_0032f49f;
        }
        uVar24 = (uVar8 != 1 | 2) << 6;
        if (uVar8 == 0) {
          uVar24 = 0x40;
        }
        pIVar14 = Io_BlifHashFindOrAdd(p,(char *)ppvVar11[1]);
        *(byte *)pIVar14 = *(byte *)pIVar14 | 4;
        pVVar10 = p->vLis;
        uVar8 = pVVar10->nCap;
        if (pVVar10->nSize == uVar8) {
          if ((int)uVar8 < 0x10) {
            if (pVVar10->pArray == (void **)0x0) {
              ppvVar11 = (void **)malloc(0x80);
            }
            else {
              ppvVar11 = (void **)realloc(pVVar10->pArray,0x80);
            }
            pVVar10->pArray = ppvVar11;
            iVar6 = 0x10;
          }
          else {
            iVar6 = uVar8 * 2;
            if (iVar6 <= (int)uVar8) goto LAB_0032ef24;
            if (pVVar10->pArray == (void **)0x0) {
              ppvVar11 = (void **)malloc((ulong)uVar8 << 4);
            }
            else {
              ppvVar11 = (void **)realloc(pVVar10->pArray,(ulong)uVar8 << 4);
            }
            pVVar10->pArray = ppvVar11;
          }
          pVVar10->nCap = iVar6;
        }
LAB_0032ef24:
        iVar6 = pVVar10->nSize;
        pVVar10->nSize = iVar6 + 1;
        pVVar10->pArray[iVar6] = pIVar14;
        *(uint *)pIVar14 = *(uint *)pIVar14 & 0xffffff3f | uVar24;
        if (p->vTokens->nSize < 3) goto LAB_0032f731;
        pIVar14 = Io_BlifHashFindOrAdd(p,(char *)p->vTokens->pArray[2]);
        uVar8 = *(uint *)pIVar14;
        if ((uVar8 & 1) != 0) {
          uVar15 = (ulong)p->vLines->nSize;
          uVar23 = 0xffffffff;
          if ((long)uVar15 < 1) goto LAB_0032f63c;
          uVar22 = 0;
          goto LAB_0032f4d7;
        }
        if ((uVar8 & 8) != 0) {
          uVar15 = (ulong)p->vLines->nSize;
          uVar23 = 0xffffffff;
          if ((long)uVar15 < 1) goto LAB_0032f667;
          uVar22 = 0;
          goto LAB_0032f50f;
        }
        *(uint *)pIVar14 = uVar8 | 8;
        pVVar10 = p->vLos;
        uVar8 = pVVar10->nCap;
        if (pVVar10->nSize == uVar8) {
          if ((int)uVar8 < 0x10) {
            if (pVVar10->pArray == (void **)0x0) {
              ppvVar11 = (void **)malloc(0x80);
            }
            else {
              ppvVar11 = (void **)realloc(pVVar10->pArray,0x80);
            }
            pVVar10->pArray = ppvVar11;
            iVar6 = 0x10;
          }
          else {
            iVar6 = uVar8 * 2;
            if (iVar6 <= (int)uVar8) goto LAB_0032efef;
            if (pVVar10->pArray == (void **)0x0) {
              ppvVar11 = (void **)malloc((ulong)uVar8 << 4);
            }
            else {
              ppvVar11 = (void **)realloc(pVVar10->pArray,(ulong)uVar8 << 4);
            }
            pVVar10->pArray = ppvVar11;
          }
          pVVar10->nCap = iVar6;
        }
LAB_0032efef:
        iVar6 = pVVar10->nSize;
        pVVar10->nSize = iVar6 + 1;
        pVVar10->pArray[iVar6] = pIVar14;
        *(uint *)pIVar14 = *(uint *)pIVar14 & 0xffffff3f | uVar24;
        lVar12 = lVar12 + 1;
        pVVar10 = p->vLatches;
      } while (lVar12 < pVVar10->nSize);
    }
    pVVar10 = p->vNames;
    if (0 < pVVar10->nSize) {
      lVar12 = 0;
      do {
        Io_BlifSplitIntoTokens(p->vTokens,(char *)pVVar10->pArray[lVar12],'\0');
        lVar25 = (long)p->vTokens->nSize;
        if (lVar25 < 1) goto LAB_0032f731;
        ppvVar11 = p->vTokens->pArray;
        iVar6 = strcmp((char *)*ppvVar11,"names");
        if (iVar6 != 0) {
          __assert_fail("!strcmp((char *)Vec_PtrEntry(p->vTokens,0), \"names\")",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlifAig.c"
                        ,0x300,"int Io_BlifParseNames(Io_BlifMan_t *, char *)");
        }
        pcVar13 = (char *)ppvVar11[lVar25 + -1];
        pIVar14 = Io_BlifHashFindOrAdd(p,pcVar13);
        uVar8 = *(uint *)pIVar14;
        if ((uVar8 & 1) != 0) {
          uVar15 = (ulong)p->vLines->nSize;
          uVar23 = 0xffffffff;
          if ((long)uVar15 < 1) goto LAB_0032f694;
          uVar22 = 0;
          goto LAB_0032f549;
        }
        if ((uVar8 & 8) != 0) {
          uVar15 = (ulong)p->vLines->nSize;
          uVar23 = 0xffffffff;
          if ((long)uVar15 < 1) goto LAB_0032f69f;
          uVar22 = 0;
          goto LAB_0032f583;
        }
        if ((uVar8 & 0x10) != 0) {
          uVar15 = (ulong)p->vLines->nSize;
          uVar23 = 0xffffffff;
          if ((long)uVar15 < 1) goto LAB_0032f6aa;
          uVar22 = 0;
          goto LAB_0032f5bd;
        }
        *(uint *)pIVar14 = uVar8 | 0x10;
        pIVar14->pName = pcVar13;
        if (p->vTokens->nSize < 2) goto LAB_0032f731;
        *(uint *)pIVar14 =
             uVar8 & 0xf6 | 0x10 | ((int)pcVar13 - *(int *)(p->vTokens->pArray + 1)) * 0x100;
        lVar12 = lVar12 + 1;
        pVVar10 = p->vNames;
      } while (lVar12 < pVVar10->nSize);
    }
    pAVar16 = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
    p->pAig = pAVar16;
    pcVar13 = Extra_UtilStrsav(p->pModel);
    pAVar16->pName = pcVar13;
    pcVar13 = Extra_UtilStrsav(p->pFileName);
    pAVar16->pSpec = pcVar13;
    pVVar10 = p->vPis;
    if (0 < pVVar10->nSize) {
      lVar12 = 0;
      do {
        pvVar2 = pVVar10->pArray[lVar12];
        pAVar17 = Abc_NtkCreateObj(pAVar16,ABC_OBJ_PI);
        Abc_ObjAssignName(pAVar17,*(char **)((long)pvVar2 + 8),(char *)0x0);
        *(Abc_Obj_t **)((long)pvVar2 + 0x10) = pAVar17;
        lVar12 = lVar12 + 1;
        pVVar10 = p->vPis;
      } while (lVar12 < pVVar10->nSize);
    }
    pVVar10 = p->vPos;
    if (0 < pVVar10->nSize) {
      lVar12 = 0;
      do {
        pvVar2 = pVVar10->pArray[lVar12];
        pAVar17 = Abc_NtkCreateObj(pAVar16,ABC_OBJ_PO);
        Abc_ObjAssignName(pAVar17,*(char **)((long)pvVar2 + 8),(char *)0x0);
        lVar12 = lVar12 + 1;
        pVVar10 = p->vPos;
      } while (lVar12 < pVVar10->nSize);
    }
    pVVar10 = p->vLos;
    if (0 < pVVar10->nSize) {
      lVar12 = 0;
      do {
        puVar3 = (uint *)pVVar10->pArray[lVar12];
        pAVar17 = Abc_NtkCreateObj(pAVar16,ABC_OBJ_BI);
        if (p->vLis->nSize <= lVar12) goto LAB_0032f731;
        Abc_ObjAssignName(pAVar17,*(char **)((long)p->vLis->pArray[lVar12] + 8),(char *)0x0);
        pObj = Abc_NtkCreateObj(pAVar16,ABC_OBJ_LATCH);
        aVar18._0_4_ = *puVar3 >> 6 & 3;
        aVar18._4_4_ = 0;
        pObj->field_5 = aVar18;
        Abc_ObjAssignName(pObj,*(char **)(puVar3 + 2),"L");
        Abc_ObjAddFanin(pObj,pAVar17);
        pAVar17 = Abc_NtkCreateObj(pAVar16,ABC_OBJ_BO);
        Abc_ObjAssignName(pAVar17,*(char **)(puVar3 + 2),(char *)0x0);
        Abc_ObjAddFanin(pAVar17,pObj);
        *(Abc_Obj_t **)(puVar3 + 4) = pAVar17;
        lVar12 = lVar12 + 1;
        pVVar10 = p->vLos;
      } while (lVar12 < pVVar10->nSize);
    }
    pVVar10 = p->vPos;
    if (0 < pVVar10->nSize) {
      pAVar16 = (Abc_Ntk_t *)0x0;
      lVar12 = 0;
      do {
        pAVar17 = Io_BlifParseConstruct_rec(p,*(char **)((long)pVVar10->pArray[lVar12] + 8));
        if (pAVar17 == (Abc_Obj_t *)0x0) goto LAB_0032f6bd;
        pVVar10 = p->pAig->vPos;
        if (pVVar10->nSize <= lVar12) goto LAB_0032f731;
        Abc_ObjAddFanin((Abc_Obj_t *)pVVar10->pArray[lVar12],pAVar17);
        lVar12 = lVar12 + 1;
        pVVar10 = p->vPos;
      } while (lVar12 < pVVar10->nSize);
    }
    pVVar10 = p->vLis;
    if (0 < pVVar10->nSize) {
      pAVar16 = (Abc_Ntk_t *)0x0;
      lVar12 = 0;
      do {
        pAVar17 = Io_BlifParseConstruct_rec(p,*(char **)((long)pVVar10->pArray[lVar12] + 8));
        if (pAVar17 == (Abc_Obj_t *)0x0) goto LAB_0032f6bd;
        pVVar10 = p->pAig->vBoxes;
        if (pVVar10->nSize <= lVar12) goto LAB_0032f731;
        plVar4 = (long *)pVVar10->pArray[lVar12];
        Abc_ObjAddFanin(*(Abc_Obj_t **)
                         (*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[4] * 8),
                        pAVar17);
        lVar12 = lVar12 + 1;
        pVVar10 = p->vLis;
      } while (lVar12 < pVVar10->nSize);
    }
    iVar6 = p->vNames->nSize - p->nTablesRead;
    p->nTablesLeft = iVar6;
    if (iVar6 != 0) {
      printf("The number of dangling tables = %d.\n");
    }
    iVar6 = p->pAig->nObjCounts[7];
    iVar7 = p->iObjNext;
    if (0 < (long)iVar7) {
      pIVar14 = p->pObjects;
      lVar12 = 0;
      uVar8 = 0;
LAB_0032f3a4:
      if ((undefined1  [32])((undefined1  [32])pIVar14[lVar12] & (undefined1  [32])0x10) !=
          (undefined1  [32])0x0) {
        pcVar13 = pIVar14[lVar12].pName;
        sVar19 = strlen(pcVar13);
        pbVar27 = (byte *)(pcVar13 + sVar19);
        iVar20 = 0;
        do {
          if (*pbVar27 - 0x30 < 2) {
            iVar20 = iVar20 + 1;
          }
          else if (*pbVar27 == 0x2e) goto LAB_0032f3df;
          pbVar27 = pbVar27 + 1;
        } while( true );
      }
      goto LAB_0032f3e9;
    }
    uVar8 = 0;
LAB_0032f5d7:
    printf("AND nodes = %6d.  Estimate = %6d.\n",iVar6,(ulong)uVar8);
    pAVar16 = p->pAig;
    p->pAig = (Abc_Ntk_t *)0x0;
  }
  else {
    pAVar16 = (Abc_Ntk_t *)0x0;
  }
  goto LAB_0032f6bd;
  while (uVar22 = uVar22 + 1, uVar15 != uVar22) {
LAB_0032f41c:
    if (pcVar13 < p->vLines->pArray[uVar22]) {
      uVar23 = uVar22 & 0xffffffff;
      break;
    }
  }
LAB_0032f42e:
  pcVar26 = "Line %d: Primary input (%s) is defined more than once.";
  goto LAB_0032f6b6;
  while (uVar22 = uVar22 + 1, uVar15 != uVar22) {
LAB_0032f467:
    if (pcVar13 < p->vLines->pArray[uVar22]) {
      uVar23 = uVar22 & 0xffffffff;
      break;
    }
  }
LAB_0032f605:
  pAVar16 = (Abc_Ntk_t *)0x0;
  sprintf(p->sError,"Line %d: Latch does not have input name and output name.",uVar23);
  goto LAB_0032f6bd;
  while (uVar22 = uVar22 + 1, uVar15 != uVar22) {
LAB_0032f49f:
    if (pcVar13 < p->vLines->pArray[uVar22]) {
      uVar23 = uVar22 & 0xffffffff;
      break;
    }
  }
LAB_0032f61c:
  if (iVar6 == 3) goto LAB_0032f731;
  pcVar13 = (char *)ppvVar11[3];
  pcVar26 = "Line %d: Initial state of the latch is incorrect (%s).";
  goto LAB_0032f6b6;
  while (uVar22 = uVar22 + 1, uVar15 != uVar22) {
LAB_0032f4d7:
    if (pcVar13 < p->vLines->pArray[uVar22]) {
      uVar23 = uVar22 & 0xffffffff;
      break;
    }
  }
LAB_0032f63c:
  if (p->vTokens->nSize < 3) goto LAB_0032f731;
  pcVar13 = (char *)p->vTokens->pArray[2];
  pcVar26 = "Line %d: Primary input (%s) is also defined latch output.";
  goto LAB_0032f6b6;
  while (uVar22 = uVar22 + 1, uVar15 != uVar22) {
LAB_0032f50f:
    if (pcVar13 < p->vLines->pArray[uVar22]) {
      uVar23 = uVar22 & 0xffffffff;
      break;
    }
  }
LAB_0032f667:
  if (p->vTokens->nSize < 3) {
LAB_0032f731:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pcVar13 = (char *)p->vTokens->pArray[2];
  pcVar26 = "Line %d: Latch output (%s) is defined as the output of another latch.";
  goto LAB_0032f6b6;
  while (uVar22 = uVar22 + 1, uVar15 != uVar22) {
LAB_0032f549:
    if (pcVar13 < p->vLines->pArray[uVar22]) {
      uVar23 = uVar22 & 0xffffffff;
      break;
    }
  }
LAB_0032f694:
  pcVar26 = "Line %d: Primary input (%s) has a table.";
  goto LAB_0032f6b6;
  while (uVar22 = uVar22 + 1, uVar15 != uVar22) {
LAB_0032f583:
    if (pcVar13 < p->vLines->pArray[uVar22]) {
      uVar23 = uVar22 & 0xffffffff;
      break;
    }
  }
LAB_0032f69f:
  pcVar26 = "Line %d: Latch output (%s) has a table.";
  goto LAB_0032f6b6;
LAB_0032f3df:
  if (iVar20 != 0) {
    uVar8 = (uVar8 + iVar20) - 1;
  }
LAB_0032f3e9:
  lVar12 = lVar12 + 1;
  if (lVar12 == iVar7) goto LAB_0032f5d7;
  goto LAB_0032f3a4;
  while (uVar22 = uVar22 + 1, uVar15 != uVar22) {
LAB_0032f5bd:
    if (pcVar13 < p->vLines->pArray[uVar22]) {
      uVar23 = uVar22 & 0xffffffff;
      break;
    }
  }
LAB_0032f6aa:
  pcVar26 = "Line %d: Signal (%s) is defined more than once.";
LAB_0032f6b6:
  pAVar16 = (Abc_Ntk_t *)0x0;
  sprintf(p->sError,pcVar26,uVar23,pcVar13);
LAB_0032f6bd:
  if (p->sError[0] != '\0') {
    fprintf(_stdout,"%s\n",p->sError);
  }
  if (pAVar16 != (Abc_Ntk_t *)0x0) {
    Io_BlifFree(p);
    if (fCheck == 0) {
      return pAVar16;
    }
    iVar6 = Abc_NtkCheckRead(pAVar16);
    if (iVar6 != 0) {
      return pAVar16;
    }
    puts("Io_Blif: The network check has failed.");
    Abc_NtkDelete(pAVar16);
  }
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Io_ReadBlifAsAig( char * pFileName, int fCheck )
{
    FILE * pFile;
    Io_BlifMan_t * p;
    Abc_Ntk_t * pAig;

    // check that the file is available
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Io_Blif(): The file is unavailable (absent or open).\n" );
        return 0;
    }
    fclose( pFile );

    // start the file reader
    p = Io_BlifAlloc();
    p->pFileName = pFileName;
    p->pBuffer   = Io_BlifLoadFile( pFileName );
    if ( p->pBuffer == NULL )
    {
        Io_BlifFree( p );
        return NULL;
    }
    // prepare the file for parsing
    Io_BlifReadPreparse( p );
    // construct the network
    pAig = Io_BlifParse( p );
    if ( p->sError[0] )
        fprintf( stdout, "%s\n", p->sError );
    if ( pAig == NULL )
        return NULL;
    Io_BlifFree( p );

    // make sure that everything is okay with the network structure
    if ( fCheck && !Abc_NtkCheckRead( pAig ) )
    {
        printf( "Io_Blif: The network check has failed.\n" );
        Abc_NtkDelete( pAig );
        return NULL;
    }
    return pAig;
}